

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_convert.cpp
# Opt level: O2

void test_norm(string *orig,string *normal,norm_type type)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> bStack_98;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)orig);
  std::__cxx11::string::string((string *)&local_58,(string *)normal);
  test_normc<char>(&local_38,&local_58,type);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  to<wchar_t>(&local_78,orig);
  to<wchar_t>(&bStack_98,normal);
  test_normc<wchar_t>(&local_78,&bStack_98,type);
  std::__cxx11::wstring::~wstring((wstring *)&bStack_98);
  std::__cxx11::wstring::~wstring((wstring *)&local_78);
  return;
}

Assistant:

void test_norm(std::string orig,std::string normal,booster::locale::norm_type type)
{
    test_normc<char>(orig,normal,type);
    test_normc<wchar_t>(to<wchar_t>(orig),to<wchar_t>(normal),type);
    #ifdef BOOSTER_HAS_CHAR16_T
    test_normc<char16_t>(to<char16_t>(orig),to<char16_t>(normal),type);
    #endif
    #ifdef BOOSTER_HAS_CHAR32_T
    test_normc<char32_t>(to<char32_t>(orig),to<char32_t>(normal),type);
    #endif
}